

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

void arm1176_initfn(uc_struct_conflict1 *uc,CPUState *obj)

{
  ARMCPU *cpu;
  CPUState *obj_local;
  uc_struct_conflict1 *uc_local;
  
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),4);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0x11);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0x14);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0x16);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0x17);
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0x21);
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x646) = 0x410fb767;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x647) = 0x410120b5;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x63a) = 0x11111111;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31d4) = 0;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x323c) = 0x1dd20d2;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x648) = 0x50078;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x3244) = 0x111;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x649) = 0x11;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31dc) = 0x33;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x64c) = 0;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31bc) = 0x1130003;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x638) = 0x10030302;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31c4) = 0x1222100;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x634) = 0x140011;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31a4) = 0x12002111;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x635) = 0x11231121;
  *(undefined4 *)((long)obj[1].tb_jmp_cache + 0x31ac) = 0x1102131;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x636) = 0x1141;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x662) = 7;
  return;
}

Assistant:

static void arm1176_initfn(struct uc_struct *uc, CPUState *obj)
{
    ARMCPU *cpu = ARM_CPU(obj);

    set_feature(&cpu->env, ARM_FEATURE_V6K);
    set_feature(&cpu->env, ARM_FEATURE_VAPA);
    set_feature(&cpu->env, ARM_FEATURE_DUMMY_C15_REGS);
    set_feature(&cpu->env, ARM_FEATURE_CACHE_DIRTY_REG);
    set_feature(&cpu->env, ARM_FEATURE_CACHE_BLOCK_OPS);
    set_feature(&cpu->env, ARM_FEATURE_EL3);
    cpu->midr = 0x410fb767;
    cpu->reset_fpsid = 0x410120b5;
    cpu->isar.mvfr0 = 0x11111111;
    cpu->isar.mvfr1 = 0x00000000;
    cpu->ctr = 0x1dd20d2;
    cpu->reset_sctlr = 0x00050078;
    cpu->id_pfr0 = 0x111;
    cpu->id_pfr1 = 0x11;
    cpu->isar.id_dfr0 = 0x33;
    cpu->id_afr0 = 0;
    cpu->isar.id_mmfr0 = 0x01130003;
    cpu->isar.id_mmfr1 = 0x10030302;
    cpu->isar.id_mmfr2 = 0x01222100;
    cpu->isar.id_isar0 = 0x0140011;
    cpu->isar.id_isar1 = 0x12002111;
    cpu->isar.id_isar2 = 0x11231121;
    cpu->isar.id_isar3 = 0x01102131;
    cpu->isar.id_isar4 = 0x01141;
    cpu->reset_auxcr = 7;
}